

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariter.cpp
# Opt level: O1

void __thiscall
icu_63::CharacterIterator::CharacterIterator
          (CharacterIterator *this,int32_t length,int32_t position)

{
  int iVar1;
  
  (this->super_ForwardCharacterIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CharacterIterator_00403410;
  this->textLength = length;
  this->pos = position;
  this->begin = 0;
  this->end = length;
  if (length < 0) {
    this->end = 0;
    this->textLength = 0;
  }
  if (position < 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = this->end;
    if (position <= iVar1) {
      return;
    }
  }
  this->pos = iVar1;
  return;
}

Assistant:

CharacterIterator::CharacterIterator(int32_t length, int32_t position)
: textLength(length), pos(position), begin(0), end(length) {
    if(textLength < 0) {
        textLength = end = 0;
    }
    if(pos < 0) {
        pos = 0;
    } else if(pos > end) {
        pos = end;
    }
}